

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O0

OPJ_BOOL opj_tcd_mct_decode(opj_tcd_t *p_tcd,opj_event_mgr_t *p_manager)

{
  uint uVar1;
  uint uVar2;
  opj_tcd_tile_t *poVar3;
  opj_tcp_t *poVar4;
  opj_tcd_resolution_t *poVar5;
  opj_tcd_resolution_t *poVar6;
  OPJ_BOOL OVar7;
  OPJ_BYTE **pData;
  OPJ_BYTE **l_data;
  opj_tcd_resolution_t *res_comp2_1;
  opj_tcd_resolution_t *res_comp1_1;
  opj_tcd_resolution_t *res_comp0_1;
  opj_tcd_resolution_t *res_comp2;
  opj_tcd_resolution_t *res_comp1;
  opj_tcd_resolution_t *res_comp0;
  OPJ_UINT32 i;
  OPJ_UINT32 l_samples;
  opj_tcd_tilecomp_t *l_tile_comp;
  opj_tcp_t *l_tcp;
  opj_tcd_tile_t *l_tile;
  opj_event_mgr_t *p_manager_local;
  opj_tcd_t *p_tcd_local;
  
  poVar3 = p_tcd->tcd_image->tiles;
  poVar4 = p_tcd->tcp;
  _i = poVar3->comps;
  if ((poVar4->mct == 0) || (p_tcd->used_component != (OPJ_BOOL *)0x0)) {
    return 1;
  }
  if (p_tcd->whole_tile_decoding == 0) {
    poVar5 = poVar3->comps->resolutions;
    uVar1 = p_tcd->image->comps->resno_decoded;
    res_comp0._4_4_ =
         (poVar5[uVar1].win_x1 - poVar5[uVar1].win_x0) *
         (poVar5[uVar1].win_y1 - poVar5[uVar1].win_y0);
    if (2 < poVar3->numcomps) {
      poVar5 = poVar3->comps[1].resolutions;
      uVar1 = p_tcd->image->comps[1].resno_decoded;
      poVar6 = poVar3->comps[2].resolutions;
      uVar2 = p_tcd->image->comps[2].resno_decoded;
      if ((((p_tcd->image->comps->resno_decoded != p_tcd->image->comps[1].resno_decoded) ||
           (p_tcd->image->comps->resno_decoded != p_tcd->image->comps[2].resno_decoded)) ||
          ((ulong)(poVar5[uVar1].win_x1 - poVar5[uVar1].win_x0) *
           (ulong)(poVar5[uVar1].win_y1 - poVar5[uVar1].win_y0) - (ulong)res_comp0._4_4_ != 0)) ||
         ((ulong)(poVar6[uVar2].win_x1 - poVar6[uVar2].win_x0) *
          (ulong)(poVar6[uVar2].win_y1 - poVar6[uVar2].win_y0) - (ulong)res_comp0._4_4_ != 0)) {
        opj_event_msg(p_manager,1,"Tiles don\'t all have the same dimension. Skip the MCT step.\n");
        return 0;
      }
    }
  }
  else {
    poVar5 = poVar3->comps->resolutions;
    uVar1 = _i->minimum_num_resolutions;
    res_comp0._4_4_ =
         (poVar5[(ulong)uVar1 - 1].x1 - poVar5[(ulong)uVar1 - 1].x0) *
         (poVar5[(ulong)uVar1 - 1].y1 - poVar5[(ulong)uVar1 - 1].y0);
    if ((2 < poVar3->numcomps) &&
       ((_i->minimum_num_resolutions != poVar3->comps[1].minimum_num_resolutions ||
        (_i->minimum_num_resolutions != poVar3->comps[2].minimum_num_resolutions)))) {
      opj_event_msg(p_manager,1,"Tiles don\'t all have the same dimension. Skip the MCT step.\n");
      return 0;
    }
    if (2 < poVar3->numcomps) {
      poVar5 = poVar3->comps[1].resolutions;
      uVar1 = _i->minimum_num_resolutions;
      poVar6 = poVar3->comps[2].resolutions;
      uVar2 = _i->minimum_num_resolutions;
      if (((p_tcd->image->comps->resno_decoded != p_tcd->image->comps[1].resno_decoded) ||
          (p_tcd->image->comps->resno_decoded != p_tcd->image->comps[2].resno_decoded)) ||
         (((long)(poVar5[(ulong)uVar1 - 1].x1 - poVar5[(ulong)uVar1 - 1].x0) *
           (long)(poVar5[(ulong)uVar1 - 1].y1 - poVar5[(ulong)uVar1 - 1].y0) -
           (ulong)res_comp0._4_4_ != 0 ||
          ((long)(poVar6[(ulong)uVar2 - 1].x1 - poVar6[(ulong)uVar2 - 1].x0) *
           (long)(poVar6[(ulong)uVar2 - 1].y1 - poVar6[(ulong)uVar2 - 1].y0) -
           (ulong)res_comp0._4_4_ != 0)))) {
        opj_event_msg(p_manager,1,"Tiles don\'t all have the same dimension. Skip the MCT step.\n");
        return 0;
      }
    }
  }
  if (poVar3->numcomps < 3) {
    opj_event_msg(p_manager,1,
                  "Number of components (%d) is inconsistent with a MCT. Skip the MCT step.\n",
                  (ulong)poVar3->numcomps);
  }
  else if (poVar4->mct == 2) {
    if (poVar4->m_mct_decoding_matrix == (OPJ_FLOAT32 *)0x0) {
      return 1;
    }
    pData = (OPJ_BYTE **)opj_malloc((ulong)poVar3->numcomps << 3);
    if (pData == (OPJ_BYTE **)0x0) {
      return 0;
    }
    for (res_comp0._0_4_ = 0; (uint)res_comp0 < poVar3->numcomps;
        res_comp0._0_4_ = (uint)res_comp0 + 1) {
      if (p_tcd->whole_tile_decoding == 0) {
        pData[(uint)res_comp0] = (OPJ_BYTE *)_i->data_win;
      }
      else {
        pData[(uint)res_comp0] = (OPJ_BYTE *)_i->data;
      }
      _i = _i + 1;
    }
    OVar7 = opj_mct_decode_custom
                      ((OPJ_BYTE *)poVar4->m_mct_decoding_matrix,(ulong)res_comp0._4_4_,pData,
                       poVar3->numcomps,p_tcd->image->comps->sgnd);
    if (OVar7 == 0) {
      opj_free(pData);
      return 0;
    }
    opj_free(pData);
  }
  else if (poVar4->tccps->qmfbid == 1) {
    if (p_tcd->whole_tile_decoding == 0) {
      opj_mct_decode(poVar3->comps->data_win,poVar3->comps[1].data_win,poVar3->comps[2].data_win,
                     (ulong)res_comp0._4_4_);
    }
    else {
      opj_mct_decode(poVar3->comps->data,poVar3->comps[1].data,poVar3->comps[2].data,
                     (ulong)res_comp0._4_4_);
    }
  }
  else if (p_tcd->whole_tile_decoding == 0) {
    opj_mct_decode_real((OPJ_FLOAT32 *)poVar3->comps->data_win,
                        (OPJ_FLOAT32 *)poVar3->comps[1].data_win,
                        (OPJ_FLOAT32 *)poVar3->comps[2].data_win,(ulong)res_comp0._4_4_);
  }
  else {
    opj_mct_decode_real((OPJ_FLOAT32 *)poVar3->comps->data,(OPJ_FLOAT32 *)poVar3->comps[1].data,
                        (OPJ_FLOAT32 *)poVar3->comps[2].data,(ulong)res_comp0._4_4_);
  }
  return 1;
}

Assistant:

static OPJ_BOOL opj_tcd_mct_decode(opj_tcd_t *p_tcd, opj_event_mgr_t *p_manager)
{
    opj_tcd_tile_t * l_tile = p_tcd->tcd_image->tiles;
    opj_tcp_t * l_tcp = p_tcd->tcp;
    opj_tcd_tilecomp_t * l_tile_comp = l_tile->comps;
    OPJ_UINT32 l_samples, i;

    if (l_tcp->mct == 0 || p_tcd->used_component != NULL) {
        return OPJ_TRUE;
    }

    if (p_tcd->whole_tile_decoding) {
        opj_tcd_resolution_t* res_comp0 = l_tile->comps[0].resolutions +
                                          l_tile_comp->minimum_num_resolutions - 1;

        /* A bit inefficient: we process more data than needed if */
        /* resno_decoded < l_tile_comp->minimum_num_resolutions-1, */
        /* but we would need to take into account a stride then */
        l_samples = (OPJ_UINT32)((res_comp0->x1 - res_comp0->x0) *
                                 (res_comp0->y1 - res_comp0->y0));
        if (l_tile->numcomps >= 3) {
            if (l_tile_comp->minimum_num_resolutions !=
                    l_tile->comps[1].minimum_num_resolutions ||
                    l_tile_comp->minimum_num_resolutions !=
                    l_tile->comps[2].minimum_num_resolutions) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "Tiles don't all have the same dimension. Skip the MCT step.\n");
                return OPJ_FALSE;
            }
        }
        if (l_tile->numcomps >= 3) {
            opj_tcd_resolution_t* res_comp1 = l_tile->comps[1].resolutions +
                                              l_tile_comp->minimum_num_resolutions - 1;
            opj_tcd_resolution_t* res_comp2 = l_tile->comps[2].resolutions +
                                              l_tile_comp->minimum_num_resolutions - 1;
            /* testcase 1336.pdf.asan.47.376 */
            if (p_tcd->image->comps[0].resno_decoded !=
                    p_tcd->image->comps[1].resno_decoded ||
                    p_tcd->image->comps[0].resno_decoded !=
                    p_tcd->image->comps[2].resno_decoded ||
                    (OPJ_SIZE_T)(res_comp1->x1 - res_comp1->x0) *
                    (OPJ_SIZE_T)(res_comp1->y1 - res_comp1->y0) != l_samples ||
                    (OPJ_SIZE_T)(res_comp2->x1 - res_comp2->x0) *
                    (OPJ_SIZE_T)(res_comp2->y1 - res_comp2->y0) != l_samples) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "Tiles don't all have the same dimension. Skip the MCT step.\n");
                return OPJ_FALSE;
            }
        }
    } else {
        opj_tcd_resolution_t* res_comp0 = l_tile->comps[0].resolutions +
                                          p_tcd->image->comps[0].resno_decoded;

        l_samples = (res_comp0->win_x1 - res_comp0->win_x0) *
                    (res_comp0->win_y1 - res_comp0->win_y0);
        if (l_tile->numcomps >= 3) {
            opj_tcd_resolution_t* res_comp1 = l_tile->comps[1].resolutions +
                                              p_tcd->image->comps[1].resno_decoded;
            opj_tcd_resolution_t* res_comp2 = l_tile->comps[2].resolutions +
                                              p_tcd->image->comps[2].resno_decoded;
            /* testcase 1336.pdf.asan.47.376 */
            if (p_tcd->image->comps[0].resno_decoded !=
                    p_tcd->image->comps[1].resno_decoded ||
                    p_tcd->image->comps[0].resno_decoded !=
                    p_tcd->image->comps[2].resno_decoded ||
                    (OPJ_SIZE_T)(res_comp1->win_x1 - res_comp1->win_x0) *
                    (OPJ_SIZE_T)(res_comp1->win_y1 - res_comp1->win_y0) != l_samples ||
                    (OPJ_SIZE_T)(res_comp2->win_x1 - res_comp2->win_x0) *
                    (OPJ_SIZE_T)(res_comp2->win_y1 - res_comp2->win_y0) != l_samples) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "Tiles don't all have the same dimension. Skip the MCT step.\n");
                return OPJ_FALSE;
            }
        }
    }

    if (l_tile->numcomps >= 3) {
        if (l_tcp->mct == 2) {
            OPJ_BYTE ** l_data;

            if (! l_tcp->m_mct_decoding_matrix) {
                return OPJ_TRUE;
            }

            l_data = (OPJ_BYTE **) opj_malloc(l_tile->numcomps * sizeof(OPJ_BYTE*));
            if (! l_data) {
                return OPJ_FALSE;
            }

            for (i = 0; i < l_tile->numcomps; ++i) {
                if (p_tcd->whole_tile_decoding) {
                    l_data[i] = (OPJ_BYTE*) l_tile_comp->data;
                } else {
                    l_data[i] = (OPJ_BYTE*) l_tile_comp->data_win;
                }
                ++l_tile_comp;
            }

            if (! opj_mct_decode_custom(/* MCT data */
                        (OPJ_BYTE*) l_tcp->m_mct_decoding_matrix,
                        /* size of components */
                        l_samples,
                        /* components */
                        l_data,
                        /* nb of components (i.e. size of pData) */
                        l_tile->numcomps,
                        /* tells if the data is signed */
                        p_tcd->image->comps->sgnd)) {
                opj_free(l_data);
                return OPJ_FALSE;
            }

            opj_free(l_data);
        } else {
            if (l_tcp->tccps->qmfbid == 1) {
                if (p_tcd->whole_tile_decoding) {
                    opj_mct_decode(l_tile->comps[0].data,
                                   l_tile->comps[1].data,
                                   l_tile->comps[2].data,
                                   l_samples);
                } else {
                    opj_mct_decode(l_tile->comps[0].data_win,
                                   l_tile->comps[1].data_win,
                                   l_tile->comps[2].data_win,
                                   l_samples);
                }
            } else {
                if (p_tcd->whole_tile_decoding) {
                    opj_mct_decode_real((OPJ_FLOAT32*)l_tile->comps[0].data,
                                        (OPJ_FLOAT32*)l_tile->comps[1].data,
                                        (OPJ_FLOAT32*)l_tile->comps[2].data,
                                        l_samples);
                } else {
                    opj_mct_decode_real((OPJ_FLOAT32*)l_tile->comps[0].data_win,
                                        (OPJ_FLOAT32*)l_tile->comps[1].data_win,
                                        (OPJ_FLOAT32*)l_tile->comps[2].data_win,
                                        l_samples);
                }
            }
        }
    } else {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Number of components (%d) is inconsistent with a MCT. Skip the MCT step.\n",
                      l_tile->numcomps);
    }

    return OPJ_TRUE;
}